

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O0

void golf_editor_draw(void)

{
  int iVar1;
  int point0_idx;
  int point1_idx;
  undefined4 uVar2;
  undefined4 uVar3;
  golf_geo_t *pgVar4;
  undefined4 uVar6;
  ulong uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  golf_transform_t transform;
  undefined4 uVar16;
  _Bool _Var17;
  golf_geo_point_t *pgVar18;
  golf_model_t *pgVar19;
  long lVar20;
  undefined8 *puVar21;
  float *pfVar22;
  byte bVar23;
  vec3 vVar24;
  vec3 vVar25;
  vec3 vVar26;
  golf_edit_mode_entity_t gVar27;
  vec4 vVar28;
  undefined4 in_stack_ffffffffffffe3d0;
  float in_stack_ffffffffffffe3d4;
  float local_1c18 [2];
  float afStack_1c10 [2];
  float local_1c08 [2];
  float afStack_1c00 [2];
  float local_1bf8 [2];
  float afStack_1bf0 [2];
  float local_1be8 [2];
  float afStack_1be0 [267];
  undefined4 local_17b4;
  golf_model_t *local_17b0;
  undefined4 local_17a4;
  golf_model_t *local_17a0;
  undefined4 local_1794;
  golf_model_t *local_1790;
  char local_1788;
  undefined7 uStack_1787;
  float local_1780;
  undefined4 local_177c;
  golf_model_t *local_1778;
  undefined1 *local_1770;
  undefined8 local_1768;
  undefined8 local_1760;
  undefined1 local_1758 [8];
  golf_material_t material_3;
  float alpha_1;
  float local_12e0;
  float fStack_12dc;
  vec3 color_3;
  int count_3;
  int start_vertex_1;
  golf_model_t *model_3;
  undefined1 local_12a0 [8];
  golf_material_t material_2;
  float alpha;
  float local_e28;
  float fStack_e24;
  vec3 color_2;
  int count_2;
  int start_vertex;
  golf_model_t *model_2;
  golf_edit_mode_entity_t entity_1;
  undefined1 local_dc8 [8];
  golf_material_t material_1;
  int count_1;
  int start_1;
  golf_model_t *model_1;
  undefined1 auStack_938 [8];
  mat4 line_model_mat;
  golf_edit_mode_entity_t entity_2;
  float local_868;
  float fStack_864;
  vec3 color_1;
  float sz_1;
  vec3 pos1;
  vec3 pos0;
  undefined4 uStack_7f4;
  golf_geo_point_t p1;
  golf_geo_point_t p0;
  int idx1;
  int idx0;
  int i_2;
  int n;
  golf_geo_face_t face;
  int i_1;
  undefined1 local_718 [8];
  golf_material_t material;
  golf_edit_mode_entity_t entity;
  undefined8 local_228;
  vec3 color;
  int count;
  int start;
  golf_model_t *model;
  mat4 local_1d8;
  undefined8 local_198;
  float local_190;
  mat4 local_188;
  undefined1 auStack_148 [8];
  mat4 sphere_model_mat;
  float sz;
  vec3 pos;
  golf_geo_point_t p;
  int i;
  mat4 model_mat;
  golf_geo_t *geo;
  sg_pass_action action;
  golf_config_t *editor_cfg;
  
  bVar23 = 0;
  action._96_8_ = golf_data_get_config("data/config/editor.cfg");
  memset(&geo,0,0x68);
  geo._4_4_ = 1;
  action.colors[0].value.g = 1.0;
  sg_begin_default_pass
            ((sg_pass_action *)&geo,(int)(graphics->viewport_size).x,
             (int)(graphics->viewport_size).y);
  _draw_level();
  if ((editor->in_edit_mode & 1U) != 0) {
    pgVar4 = (editor->edit_mode).geo;
    uVar2 = (editor->edit_mode).transform.scale.y;
    uVar6 = (editor->edit_mode).transform.scale.z;
    uVar8 = (editor->edit_mode).transform.rotation.z;
    uVar9 = *(undefined8 *)&(editor->edit_mode).transform.rotation.w;
    transform.rotation.x = (float)uVar8;
    transform.position = (vec3)*(undefined1 (*) [12])&(editor->edit_mode).transform.position.z;
    transform.rotation.y = (float)(int)uVar9;
    transform.rotation.z = (float)(int)((ulong)uVar9 >> 0x20);
    transform.rotation.w = (float)uVar2;
    transform.scale.x = (float)uVar6;
    transform.scale.y = (float)in_stack_ffffffffffffe3d0;
    transform.scale.z = in_stack_ffffffffffffe3d4;
    golf_transform_get_model_mat(transform);
    for (p.position.y = 0.0; (int)p.position.y < (pgVar4->points).length;
        p.position.y = (float)((int)p.position.y + 1)) {
      pgVar18 = (pgVar4->points).data + (int)p.position.y;
      uVar5._0_1_ = pgVar18->active;
      uVar5._1_3_ = *(undefined3 *)&pgVar18->field_0x1;
      uVar5._4_4_ = (pgVar18->position).x;
      uVar3 = (pgVar18->position).y;
      uVar7 = (pgVar18->position).z;
      if ((uVar5 & 1) != 0) {
        vVar24.y = (float)uVar3;
        vVar24.x = (float)uVar5._4_4_;
        vVar24.z = (float)uVar7;
        m.m[1] = (float)i;
        m.m[0] = p.position.z;
        m.m[2] = model_mat.m[0];
        m.m[3] = model_mat.m[1];
        m.m[4] = model_mat.m[2];
        m.m[5] = model_mat.m[3];
        m.m[6] = model_mat.m[4];
        m.m[7] = model_mat.m[5];
        m.m[8] = model_mat.m[6];
        m.m[9] = model_mat.m[7];
        m.m[10] = model_mat.m[8];
        m.m[0xb] = model_mat.m[9];
        m.m[0xc] = model_mat.m[10];
        m.m[0xd] = model_mat.m[0xb];
        m.m[0xe] = model_mat.m[0xc];
        m.m[0xf] = model_mat.m[0xd];
        vVar24 = vec3_apply_mat4(vVar24,1.0,m);
        sphere_model_mat.m[0xf] =
             golf_config_get_num((golf_config_t *)action._96_8_,"edit_mode_sphere_size");
        local_198 = vVar24._0_8_;
        local_190 = vVar24.z;
        mat4_translation(&local_188,vVar24);
        vVar24 = vec3_create(sphere_model_mat.m[0xf],sphere_model_mat.m[0xf],sphere_model_mat.m[0xf]
                            );
        mat4_scale(&local_1d8,vVar24);
        local_1be8[0] = local_1d8.m[0xc];
        local_1be8[1] = local_1d8.m[0xd];
        afStack_1be0[0] = local_1d8.m[0xe];
        afStack_1be0[1] = local_1d8.m[0xf];
        local_1bf8[0] = local_1d8.m[8];
        local_1bf8[1] = local_1d8.m[9];
        afStack_1bf0[0] = local_1d8.m[10];
        afStack_1bf0[1] = local_1d8.m[0xb];
        local_1c08[0] = local_1d8.m[4];
        local_1c08[1] = local_1d8.m[5];
        afStack_1c00[0] = local_1d8.m[6];
        afStack_1c00[1] = local_1d8.m[7];
        local_1c18[0] = local_1d8.m[0];
        local_1c18[1] = local_1d8.m[1];
        afStack_1c10[0] = local_1d8.m[2];
        afStack_1c10[1] = local_1d8.m[3];
        local_1770 = &stack0xffffffffffffe3a8;
        mat4_multiply_n((mat4 *)auStack_148,2);
        pgVar19 = golf_data_get_model("data/models/sphere.obj");
        iVar1 = (pgVar19->positions).length;
        vVar24 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_selectable_color");
        color.x = vVar24.z;
        local_228 = vVar24._0_8_;
        gVar27 = golf_edit_mode_entity_point((int)p.position.y);
        _Var17 = golf_editor_is_edit_entity_hovered(gVar27);
        if (_Var17) {
          vVar24 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_hovered_color");
          color.x = vVar24.z;
          local_228 = vVar24._0_8_;
        }
        else {
          _Var17 = golf_editor_is_edit_entity_selected(gVar27);
          if (_Var17) {
            vVar24 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_selected_color")
            ;
            color.x = vVar24.z;
            material.field_6.field_0.texture = (golf_texture_t *)vVar24._0_8_;
            local_228 = material.field_6.field_0.texture;
          }
        }
        vVar28 = vec4_create((float)local_228,local_228._4_4_,color.x,1.0);
        golf_material_color((golf_material_t *)local_718,"",0.0,0.0,0.0,vVar28);
        local_177c = 0;
        puVar21 = (undefined8 *)local_718;
        pfVar22 = local_1c18;
        local_1778 = pgVar19;
        for (lVar20 = 0x8c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *(undefined8 *)pfVar22 = *puVar21;
          puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
          pfVar22 = pfVar22 + ((ulong)bVar23 * -2 + 1) * 2;
        }
        _golf_renderer_draw_solid_color_material(local_1778,local_177c,iVar1);
      }
    }
    for (face.water_dir.z = 0.0; (int)face.water_dir.z < (pgVar4->faces).length;
        face.water_dir.z = (float)((int)face.water_dir.z + 1)) {
      memcpy(&i_2,(pgVar4->faces).data + (int)face.water_dir.z,0x90);
      iVar1 = (int)face.idx.data;
      if (((byte)i_2 & 1) != 0) {
        for (idx1 = 0; idx1 < iVar1; idx1 = idx1 + 1) {
          point0_idx = *(int *)(face._64_8_ + (long)idx1 * 4);
          local_1788 = face.material_name[0x3f];
          uStack_1787 = face._65_7_;
          point1_idx = *(int *)(face._64_8_ + (long)((idx1 + 1) % iVar1) * 4);
          pgVar18 = (pgVar4->points).data + point0_idx;
          uVar10 = (pgVar18->position).x;
          uVar11 = (pgVar18->position).y;
          uVar12 = (pgVar18->position).z;
          pgVar18 = (pgVar4->points).data + point1_idx;
          uVar13 = (pgVar18->position).x;
          uVar14 = (pgVar18->position).y;
          uVar15 = (pgVar18->position).z;
          vVar26.y = (float)uVar11;
          vVar26.x = (float)uVar10;
          vVar26.z = (float)uVar12;
          local_1780 = 1.0;
          m_00.m[1] = (float)i;
          m_00.m[0] = p.position.z;
          m_00.m[2] = model_mat.m[0];
          m_00.m[3] = model_mat.m[1];
          m_00.m[4] = model_mat.m[2];
          m_00.m[5] = model_mat.m[3];
          m_00.m[6] = model_mat.m[4];
          m_00.m[7] = model_mat.m[5];
          m_00.m[8] = model_mat.m[6];
          m_00.m[9] = model_mat.m[7];
          m_00.m[10] = model_mat.m[8];
          m_00.m[0xb] = model_mat.m[9];
          m_00.m[0xc] = model_mat.m[10];
          m_00.m[0xd] = model_mat.m[0xb];
          m_00.m[0xe] = model_mat.m[0xc];
          m_00.m[0xf] = model_mat.m[0xd];
          vVar24 = vec3_apply_mat4(vVar26,1.0,m_00);
          vVar25.y = (float)uVar14;
          vVar25.x = (float)uVar13;
          vVar25.z = (float)uVar15;
          m_01.m[1] = (float)i;
          m_01.m[0] = p.position.z;
          m_01.m[2] = model_mat.m[0];
          m_01.m[3] = model_mat.m[1];
          m_01.m[4] = model_mat.m[2];
          m_01.m[5] = model_mat.m[3];
          m_01.m[6] = model_mat.m[4];
          m_01.m[7] = model_mat.m[5];
          m_01.m[8] = model_mat.m[6];
          m_01.m[9] = model_mat.m[7];
          m_01.m[10] = model_mat.m[8];
          m_01.m[0xb] = model_mat.m[9];
          m_01.m[0xc] = model_mat.m[10];
          m_01.m[0xd] = model_mat.m[0xb];
          m_01.m[0xe] = model_mat.m[0xc];
          m_01.m[0xf] = model_mat.m[0xd];
          vVar25 = vec3_apply_mat4(vVar25,local_1780,m_01);
          color_1.y = golf_config_get_num((golf_config_t *)action._96_8_,"edit_mode_line_size");
          vVar26 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_selectable_color")
          ;
          color_1.x = vVar26.z;
          _local_868 = vVar26._0_8_;
          gVar27 = golf_edit_mode_entity_line(point0_idx,point1_idx);
          _Var17 = golf_editor_is_edit_entity_hovered(gVar27);
          if (_Var17) {
            vVar26 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_hovered_color");
            color_1.x = vVar26.z;
            _local_868 = vVar26._0_8_;
            color_1.y = color_1.y + 0.001;
          }
          else {
            _Var17 = golf_editor_is_edit_entity_selected(gVar27);
            if (_Var17) {
              vVar26 = golf_config_get_vec3
                                 ((golf_config_t *)action._96_8_,"edit_mode_selected_color");
              color_1.x = vVar26.z;
              line_model_mat.m._56_8_ = vVar26._0_8_;
              color_1.y = color_1.y + 0.001;
              _local_868 = line_model_mat.m._56_8_;
            }
          }
          mat4_box_to_line_transform((mat4 *)auStack_938,vVar24,vVar25,color_1.y);
          pgVar19 = golf_data_get_model("data/models/cube.obj");
          material_1.field_6._1028_4_ = 0;
          material_1.field_6._1024_4_ = (pgVar19->positions).length;
          vVar28 = vec4_create(local_868,fStack_864,color_1.x,1.0);
          golf_material_color((golf_material_t *)local_dc8,"",0.0,0.0,0.0,vVar28);
          local_1794 = material_1.field_6._1028_4_;
          puVar21 = (undefined8 *)local_dc8;
          pfVar22 = local_1c18;
          local_1790 = pgVar19;
          for (lVar20 = 0x8c; lVar20 != 0; lVar20 = lVar20 + -1) {
            *(undefined8 *)pfVar22 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
            pfVar22 = pfVar22 + ((ulong)bVar23 * -2 + 1) * 2;
          }
          _golf_renderer_draw_solid_color_material
                    (local_1790,local_1794,material_1.field_6._1024_4_);
        }
        gVar27 = golf_edit_mode_entity_face((int)face.water_dir.z);
        _Var17 = golf_editor_is_edit_entity_hovered(gVar27);
        uVar16 = face.uvs.alloc_category._0_4_;
        if (_Var17) {
          vVar24 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_hovered_color");
          material_2.field_6._1028_4_ =
               golf_config_get_num((golf_config_t *)action._96_8_,"edit_mode_hovered_face_alpha");
          local_e28 = vVar24.x;
          fStack_e24 = vVar24.y;
          vVar28 = vec4_create(local_e28,fStack_e24,vVar24.z,material_2.field_6._1028_4_);
          golf_material_color((golf_material_t *)local_12a0,"",0.0,0.0,0.0,vVar28);
          local_17a4 = uVar16;
          puVar21 = (undefined8 *)local_12a0;
          pfVar22 = local_1c18;
          local_17a0 = &pgVar4->model;
          for (lVar20 = 0x8c; lVar20 != 0; lVar20 = lVar20 + -1) {
            *(undefined8 *)pfVar22 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
            pfVar22 = pfVar22 + ((ulong)bVar23 * -2 + 1) * 2;
          }
          _golf_renderer_draw_solid_color_material(local_17a0,local_17a4,iVar1 * 3 + -6);
        }
        else {
          _Var17 = golf_editor_is_edit_entity_selected(gVar27);
          uVar16 = face.uvs.alloc_category._0_4_;
          if (_Var17) {
            vVar24 = golf_config_get_vec3((golf_config_t *)action._96_8_,"edit_mode_selected_color")
            ;
            material_3.field_6._1028_4_ =
                 golf_config_get_num((golf_config_t *)action._96_8_,"edit_mode_selected_face_alpha")
            ;
            local_12e0 = vVar24.x;
            fStack_12dc = vVar24.y;
            vVar28 = vec4_create(local_12e0,fStack_12dc,vVar24.z,material_3.field_6._1028_4_);
            local_1768 = vVar28._0_8_;
            local_1760 = vVar28._8_8_;
            golf_material_color((golf_material_t *)local_1758,"",0.0,0.0,0.0,vVar28);
            local_17b4 = uVar16;
            puVar21 = (undefined8 *)local_1758;
            pfVar22 = local_1c18;
            local_17b0 = &pgVar4->model;
            for (lVar20 = 0x8c; lVar20 != 0; lVar20 = lVar20 + -1) {
              *(undefined8 *)pfVar22 = *puVar21;
              puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
              pfVar22 = pfVar22 + ((ulong)bVar23 * -2 + 1) * 2;
            }
            _golf_renderer_draw_solid_color_material(local_17b0,local_17b4,iVar1 * 3 + -6);
          }
        }
      }
    }
  }
  sg_end_pass();
  return;
}

Assistant:

void golf_editor_draw(void) {
    golf_config_t *editor_cfg = golf_data_get_config("data/config/editor.cfg");

    sg_pass_action action = {
        .colors[0] = {
            .action = SG_ACTION_CLEAR,
            .value = { 0, 0, 0, 1 },
        },
    };
    sg_begin_default_pass(&action, (int)graphics->viewport_size.x, (int)graphics->viewport_size.y);

    _draw_level();

    if (editor->in_edit_mode) {
        golf_geo_t *geo = editor->edit_mode.geo;
        mat4 model_mat = golf_transform_get_model_mat(editor->edit_mode.transform);

        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t p = geo->points.data[i];
            if (!p.active) continue;

            vec3 pos = vec3_apply_mat4(p.position, 1, model_mat);
            float sz = CFG_NUM(editor_cfg, "edit_mode_sphere_size");
            mat4 sphere_model_mat = mat4_multiply_n(2, mat4_translation(pos), mat4_scale(V3(sz, sz, sz)));
            golf_model_t *model = golf_data_get_model("data/models/sphere.obj");
            int start = 0;
            int count = model->positions.length;
            vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
            golf_edit_mode_entity_t entity = golf_edit_mode_entity_point(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {  
                color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
            }
            golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
            _golf_renderer_draw_solid_color_material(model, start, count, sphere_model_mat, material);
        }

        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];
            if (!face.active) continue;

            int n = face.idx.length;
            for (int i = 0; i < n; i++) {
                int idx0 = face.idx.data[i];
                int idx1 = face.idx.data[(i + 1) % n];
                golf_geo_point_t p0 = geo->points.data[idx0];
                golf_geo_point_t p1 = geo->points.data[idx1];
                vec3 pos0 = vec3_apply_mat4(p0.position, 1, model_mat);
                vec3 pos1 = vec3_apply_mat4(p1.position, 1, model_mat);
                //vec3 pos_avg = vec3_scale(vec3_add(pos0, pos1), 0.5f);
                float sz = CFG_NUM(editor_cfg, "edit_mode_line_size");
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
                golf_edit_mode_entity_t entity = golf_edit_mode_entity_line(idx0, idx1);
                if (golf_editor_is_edit_entity_hovered(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                    sz += 0.001f;
                }
                else if (golf_editor_is_edit_entity_selected(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                    sz += 0.001f;
                }
                mat4 line_model_mat = mat4_box_to_line_transform(pos0, pos1, sz);
                golf_model_t *model = golf_data_get_model("data/models/cube.obj");
                int start = 0;
                int count = model->positions.length;
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
                _golf_renderer_draw_solid_color_material(model, start, count, line_model_mat, material);
            }

            golf_edit_mode_entity_t entity = golf_edit_mode_entity_face(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_hovered_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_selected_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
        }
    }

    sg_end_pass();
}